

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O3

intptr_t __thiscall xemmai::t_tuple::f_hash(t_tuple *this)

{
  size_t sVar1;
  ulong *puVar2;
  ulong uVar3;
  undefined8 extraout_RAX;
  t_object *p;
  ulong uVar4;
  ulong uVar5;
  t_tuple *ptVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  hash<double> local_39;
  t_tuple *local_38;
  
  if (this->v_size == 0) {
    uVar7 = 0;
  }
  else {
    ptVar6 = this + 1;
    uVar5 = 0;
    uVar7 = 0;
    local_38 = this;
    do {
      sVar1 = ptVar6->v_size;
      switch(sVar1) {
      case 0:
      case 1:
      case 2:
        uVar3 = ptVar6->v_size;
        break;
      case 3:
        uVar3 = ptVar6[1].v_size;
        break;
      case 4:
        uVar3 = std::hash<double>::operator()(&local_39,(double)ptVar6[1].v_size);
        break;
      default:
        puVar2 = *(ulong **)(in_FS_OFFSET + -0x30);
        *(ulong **)(in_FS_OFFSET + -0x30) = puVar2 + 4;
        (**(code **)(*(long *)(sVar1 + 0x40) + 200))(sVar1,puVar2);
        uVar4 = *puVar2;
        uVar3 = puVar2[1];
        *(ulong **)(in_FS_OFFSET + -0x30) = puVar2;
        this = local_38;
        goto LAB_0015d125;
      }
      uVar4 = 3;
LAB_0015d125:
      if ((uVar4 != 3) &&
         ((((uVar4 < 3 || (uVar4 == 4)) || (*(long *)(*(long *)(uVar4 + 0x40) + 8) == 0)) ||
          (*(undefined8 **)(*(long *)(*(long *)(uVar4 + 0x40) + 0x10) + 8) != &v__type_id<long>))))
      {
        f_hash();
        *(undefined8 **)(in_FS_OFFSET + -0x30) = &v__type_id<long>;
        _Unwind_Resume(extraout_RAX);
      }
      if (4 < uVar4) {
        uVar3 = *(ulong *)(uVar4 + 0x48);
      }
      uVar7 = uVar7 ^ uVar3;
      uVar5 = uVar5 + 1;
      ptVar6 = ptVar6 + 2;
    } while (uVar5 < this->v_size);
  }
  return uVar7;
}

Assistant:

intptr_t t_tuple::f_hash() const
{
	intptr_t n = 0;
	for (size_t i = 0; i < v_size; ++i) {
		auto x = (*this)[i].f_hash();
		f_check<intptr_t>(x, L"value");
		n ^= f_as<intptr_t>(x);
	}
	return n;
}